

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O1

ngx_int_t ngx_http_process_host(ngx_http_request_t *r,ngx_table_elt_t *h,ngx_uint_t offset)

{
  ngx_log_t *log;
  ngx_int_t nVar1;
  undefined1 auStack_28 [8];
  ngx_str_t host;
  
  if ((r->headers_in).host == (ngx_table_elt_t *)0x0) {
    (r->headers_in).host = h;
  }
  auStack_28 = (undefined1  [8])(h->value).len;
  host.len = (size_t)(h->value).data;
  nVar1 = ngx_http_validate_host((ngx_str_t *)auStack_28,r->pool,offset);
  if (nVar1 == -1) {
    ngx_http_close_request(r,500);
  }
  else {
    if (nVar1 != -5) {
      if ((r->headers_in).server.len == 0) {
        nVar1 = ngx_http_set_virtual_server(r,(ngx_str_t *)auStack_28);
        if (nVar1 == -1) {
          return -1;
        }
        (r->headers_in).server.len = (size_t)auStack_28;
        (r->headers_in).server.data = (u_char *)host.len;
      }
      return 0;
    }
    log = r->connection->log;
    if (6 < log->log_level) {
      ngx_log_error_core(7,log,0,"client sent invalid host header");
    }
    ngx_http_finalize_request(r,400);
  }
  return -1;
}

Assistant:

static ngx_int_t
ngx_http_process_host(ngx_http_request_t *r, ngx_table_elt_t *h,
    ngx_uint_t offset)
{
    ngx_int_t  rc;
    ngx_str_t  host;

    if (r->headers_in.host == NULL) {
        r->headers_in.host = h;
    }

    host = h->value;

    rc = ngx_http_validate_host(&host, r->pool, 0);

    if (rc == NGX_DECLINED) {
        ngx_log_error(NGX_LOG_INFO, r->connection->log, 0,
                      "client sent invalid host header");
        ngx_http_finalize_request(r, NGX_HTTP_BAD_REQUEST);
        return NGX_ERROR;
    }

    if (rc == NGX_ERROR) {
        ngx_http_close_request(r, NGX_HTTP_INTERNAL_SERVER_ERROR);
        return NGX_ERROR;
    }

    if (r->headers_in.server.len) {
        return NGX_OK;
    }

    if (ngx_http_set_virtual_server(r, &host) == NGX_ERROR) {
        return NGX_ERROR;
    }

    r->headers_in.server = host;

    return NGX_OK;
}